

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O2

void dlib::draw_line<int>(canvas *c,point *p1,point *p2,int *pixel,rectangle *area)

{
  int iVar1;
  unsigned_long uVar2;
  long lVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  uchar uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  rectangle valid_area;
  rgb_alpha_pixel local_74;
  double local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  rectangle::intersect(&c->super_rectangle,area);
  lVar3 = (p1->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[0];
  lVar13 = (p1->
           super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ).data.data[1];
  lVar6 = (p2->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[0];
  lVar5 = (p2->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[1];
  uVar8 = lVar6 - lVar3;
  if (uVar8 == 0) {
    if ((lVar3 <= local_58) && (local_68 <= lVar3)) {
      lVar6 = lVar5;
      if (lVar5 < lVar13) {
        lVar6 = lVar13;
      }
      if (lVar13 < lVar5) {
        lVar5 = lVar13;
      }
      if (lVar5 <= local_60) {
        lVar5 = local_60;
      }
      if (local_50 < lVar6) {
        lVar6 = local_50;
      }
      uVar2 = c->row_width;
      iVar1 = *pixel;
      iVar11 = 0;
      if (-1 < iVar1) {
        iVar11 = iVar1;
      }
      uVar7 = 0xff;
      if (iVar1 < 0x100) {
        uVar7 = (uchar)iVar11;
      }
      puVar4 = c->bits + (lVar5 - (c->super_rectangle).t) * uVar2 + lVar3 * 4 +
                         (c->super_rectangle).l * -4 + 2;
      for (; lVar5 <= lVar6; lVar5 = lVar5 + 1) {
        *puVar4 = uVar7;
        puVar4[-1] = uVar7;
        puVar4[-2] = uVar7;
        puVar4 = puVar4 + uVar2;
      }
    }
  }
  else {
    uVar9 = lVar5 - lVar13;
    if (uVar9 == 0) {
      if ((lVar13 <= local_50) && (local_60 <= lVar13)) {
        lVar5 = lVar6;
        if (lVar6 < lVar3) {
          lVar5 = lVar3;
        }
        if (lVar3 < lVar6) {
          lVar6 = lVar3;
        }
        if (lVar6 <= local_68) {
          lVar6 = local_68;
        }
        if (local_58 < lVar5) {
          lVar5 = local_58;
        }
        iVar1 = *pixel;
        iVar11 = 0;
        if (-1 < iVar1) {
          iVar11 = iVar1;
        }
        uVar7 = 0xff;
        if (iVar1 < 0x100) {
          uVar7 = (uchar)iVar11;
        }
        puVar4 = c->bits;
        lVar3 = (lVar13 - (c->super_rectangle).t) * c->row_width + (c->super_rectangle).l * -4;
        for (; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
          puVar4[lVar6 * 4 + lVar3 + 2] = uVar7;
          puVar4[lVar6 * 4 + lVar3 + 1] = uVar7;
          puVar4[lVar6 * 4 + lVar3] = uVar7;
        }
      }
    }
    else {
      iVar1 = *pixel;
      iVar11 = 0;
      if (-1 < iVar1) {
        iVar11 = iVar1;
      }
      local_74.red = 0xff;
      if (iVar1 < 0x100) {
        local_74.red = (uchar)iVar11;
      }
      uVar10 = -uVar9;
      if (0 < (long)uVar9) {
        uVar10 = uVar9;
      }
      uVar12 = -uVar8;
      if (0 < (long)uVar8) {
        uVar12 = uVar8;
      }
      local_74.green = local_74.red;
      local_74.blue = local_74.red;
      if (uVar10 < uVar12) {
        lVar5 = lVar6;
        if (lVar3 < lVar6) {
          lVar5 = lVar3;
        }
        if (lVar6 < lVar3) {
          lVar6 = lVar3;
        }
        if (lVar5 <= local_68) {
          lVar5 = local_68;
        }
        local_70 = (double)lVar5;
        if (local_58 < lVar6) {
          lVar6 = local_58;
        }
        local_28 = (double)lVar6;
        local_38 = (double)lVar3;
        local_40 = (double)lVar13;
        local_30 = (double)(long)uVar9 / (double)(long)uVar8;
        for (; local_70 <= local_28; local_70 = local_70 + 1.0) {
          dVar14 = (local_70 - local_38) * local_30 + local_40;
          lVar3 = (long)dVar14;
          lVar13 = (long)local_70;
          if (lVar3 <= local_50 && local_60 <= lVar3) {
            local_74.alpha = (uchar)(int)((((double)lVar3 - dVar14) + 1.0) * 255.0);
            local_48 = dVar14;
            assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                      ((pixel *)(c->bits +
                                (lVar13 - (c->super_rectangle).l) * 4 +
                                (lVar3 - (c->super_rectangle).t) * c->row_width),&local_74);
            dVar14 = local_48;
          }
          if ((local_60 <= lVar3 + 1) && (lVar3 < local_50)) {
            local_74.alpha = (uchar)(int)((dVar14 - (double)lVar3) * 255.0);
            assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                      ((pixel *)(c->bits +
                                (lVar13 - (c->super_rectangle).l) * 4 +
                                ((lVar3 + 1) - (c->super_rectangle).t) * c->row_width),&local_74);
          }
        }
      }
      else {
        lVar6 = lVar5;
        if (lVar13 < lVar5) {
          lVar6 = lVar13;
        }
        if (lVar5 < lVar13) {
          lVar5 = lVar13;
        }
        if (lVar6 <= local_60) {
          lVar6 = local_60;
        }
        local_70 = (double)lVar6;
        if (local_50 < lVar5) {
          lVar5 = local_50;
        }
        local_28 = (double)lVar5;
        local_38 = (double)lVar3;
        local_40 = (double)lVar13;
        local_30 = (double)(long)uVar8 / (double)(long)uVar9;
        for (; local_70 <= local_28; local_70 = local_70 + 1.0) {
          dVar14 = (local_70 - local_40) * local_30 + local_38;
          lVar13 = (long)local_70;
          lVar3 = (long)dVar14;
          if (lVar3 <= local_58 && local_68 <= lVar3) {
            local_74.alpha = (uchar)(int)((((double)lVar3 - dVar14) + 1.0) * 255.0);
            local_48 = dVar14;
            assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                      ((pixel *)(c->bits +
                                (lVar3 - (c->super_rectangle).l) * 4 +
                                (lVar13 - (c->super_rectangle).t) * c->row_width),&local_74);
            dVar14 = local_48;
          }
          if ((local_68 <= lVar3 + 1) && (lVar3 < local_58)) {
            local_74.alpha = (uchar)(int)((dVar14 - (double)lVar3) * 255.0);
            assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                      ((pixel *)(c->bits +
                                ((lVar3 + 1) - (c->super_rectangle).l) * 4 +
                                (lVar13 - (c->super_rectangle).t) * c->row_width),&local_74);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2,
        const pixel_type& pixel, 
        const rectangle& area = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle valid_area(c.intersect(area));
        long x1 = p1.x();
        long y1 = p1.y();
        long x2 = p2.x();
        long y2 = p2.y();
        if (x1 == x2)
        {
            // if the x coordinate is inside the canvas's area
            if (x1 <= valid_area.right() && x1 >= valid_area.left())
            {
                // make sure y1 comes before y2
                if (y1 > y2)
                    swap(y1,y2);

                y1 = std::max(y1,valid_area.top());
                y2 = std::min(y2,valid_area.bottom());
                // this is a vertical line
                for (long y = y1; y <= y2; ++y)
                {
                    assign_pixel(c[y-c.top()][x1-c.left()], pixel);
                }
            }
        }
        else if (y1 == y2)
        {
            // if the y coordinate is inside the canvas's area
            if (y1 <= valid_area.bottom() && y1 >= valid_area.top())
            {
                // make sure x1 comes before x2
                if (x1 > x2)
                    swap(x1,x2);

                x1 = std::max(x1,valid_area.left());
                x2 = std::min(x2,valid_area.right());
                // this is a horizontal line
                for (long x = x1; x <= x2; ++x)
                {
                    assign_pixel(c[y1-c.top()][x-c.left()], pixel);
                }
            }
        }
        else
        {
            rgb_alpha_pixel alpha_pixel;
            assign_pixel(alpha_pixel, pixel);
            const unsigned char max_alpha = alpha_pixel.alpha;

            const long rise = (((long)y2) - ((long)y1));
            const long run = (((long)x2) - ((long)x1));
            if (std::abs(rise) < std::abs(run))
            {
                const double slope = ((double)rise)/run;

                double first, last;

                if (x1 > x2)                
                {
                    first = std::max(x2,valid_area.left());
                    last = std::min(x1,valid_area.right());
                }
                else
                {
                    first = std::max(x1,valid_area.left());
                    last = std::min(x2,valid_area.right());
                }                             


                long y;
                long x;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dy = slope*(i-x1f) + y1f;
                    const double dx = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);


                    if (y >= valid_area.top() && y <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dy-y))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (y+1 >= valid_area.top() && y+1 <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dy-y)*max_alpha);
                        assign_pixel(c[y+1-c.top()][x-c.left()], alpha_pixel);
                    }
                }         
            }
            else
            {
                const double slope = ((double)run)/rise;

                double first, last;

                if (y1 > y2)                
                {
                    first = std::max(y2,valid_area.top());
                    last = std::min(y1,valid_area.bottom());
                }
                else
                {
                    first = std::max(y1,valid_area.top());
                    last = std::min(y2,valid_area.bottom());
                }                             

                long x;
                long y;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dx = slope*(i-y1f) + x1f;
                    const double dy = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);

                    if (x >= valid_area.left() && x <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dx-x))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (x+1 >= valid_area.left() && x+1 <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dx-x)*max_alpha);
                        assign_pixel(c[y-c.top()][x+1-c.left()], alpha_pixel);
                    }
                } 
            }
        }

    }